

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_packed_uint.h
# Opt level: O0

uint __thiscall crnlib::packed_uint::operator_cast_to_unsigned_int(packed_uint *this)

{
  packed_uint<2U> *this_local;
  
  return (uint)CONCAT11(*this,this[1]);
}

Assistant:

inline operator unsigned int() const {
    switch (N) {
      case 1:
        return m_buf[0];
      case 2:
        return (m_buf[0] << 8U) | m_buf[1];
      case 3:
        return (m_buf[0] << 16U) | (m_buf[1] << 8U) | (m_buf[2]);
      default:
        return (m_buf[0] << 24U) | (m_buf[1] << 16U) | (m_buf[2] << 8U) | (m_buf[3]);
    }
  }